

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

bool lest::search(text *part,text *line)

{
  bool bVar1;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  text *local_18;
  text *line_local;
  text *part_local;
  
  local_18 = line;
  line_local = part;
  local_30 = std::__cxx11::string::begin();
  local_28 = local_30;
  local_40 = std::__cxx11::string::end();
  local_38 = local_40;
  local_50 = std::__cxx11::string::begin();
  local_48 = local_50;
  local_60 = std::__cxx11::string::end();
  local_58 = local_60;
  local_20 = std::
             search<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,bool(*)(char,char)>
                       (local_28,local_38,local_48,local_60,case_insensitive_equal);
  local_68 = std::__cxx11::string::end();
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_20,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_68);
  return bVar1;
}

Assistant:

inline bool search( text part, text line )
    {
        return std::search(
            line.begin(), line.end(),
            part.begin(), part.end(), case_insensitive_equal ) != line.end();
    }